

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpTokens.cpp
# Opt level: O0

bool __thiscall glslang::TPpContext::TokenStream::peekUntokenizedPasting(TokenStream *this)

{
  size_t sVar1;
  bool bVar2;
  bool local_19;
  bool pasting;
  size_t savePos;
  TokenStream *this_local;
  
  sVar1 = this->currentPos;
  while (bVar2 = peekToken(this,0x20), bVar2) {
    this->currentPos = this->currentPos + 1;
  }
  local_19 = false;
  bVar2 = peekToken(this,0x23);
  if (bVar2) {
    this->currentPos = this->currentPos + 1;
    local_19 = peekToken(this,0x23);
  }
  this->currentPos = sVar1;
  return local_19;
}

Assistant:

bool TPpContext::TokenStream::peekUntokenizedPasting()
{
    // don't return early, have to restore this
    size_t savePos = currentPos;

    // skip white-space
    while (peekToken(' '))
        ++currentPos;

    // check for ##
    bool pasting = false;
    if (peekToken('#')) {
        ++currentPos;
        if (peekToken('#'))
            pasting = true;
    }

    currentPos = savePos;

    return pasting;
}